

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetTargetVersion
          (cmGeneratorTarget *this,bool soversion,int *major,int *minor,int *patch)

{
  int iVar1;
  char *pcVar2;
  int parsed_minor;
  int parsed_patch;
  int parsed_major;
  int local_50;
  int local_4c;
  string local_48;
  
  *major = 0;
  *minor = 0;
  *patch = 0;
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmState::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x11be,
                  "void cmGeneratorTarget::GetTargetVersion(bool, int &, int &, int &) const");
  }
  pcVar2 = "VERSION";
  if (soversion) {
    pcVar2 = "SOVERSION";
  }
  std::__cxx11::string::string((string *)&local_48,pcVar2,(allocator *)&local_50);
  pcVar2 = GetProperty(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (pcVar2 != (char *)0x0) {
    iVar1 = __isoc99_sscanf(pcVar2,"%d.%d.%d",&local_48,&local_50,&local_4c);
    if (iVar1 != 1) {
      if (iVar1 != 2) {
        if (iVar1 != 3) {
          return;
        }
        *patch = local_4c;
      }
      *minor = local_50;
    }
    *major = (int)local_48._M_dataplus._M_p;
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetTargetVersion(bool soversion,
                                int& major, int& minor, int& patch) const
{
  // Set the default values.
  major = 0;
  minor = 0;
  patch = 0;

  assert(this->GetType() != cmState::INTERFACE_LIBRARY);

  // Look for a VERSION or SOVERSION property.
  const char* prop = soversion? "SOVERSION" : "VERSION";
  if(const char* version = this->GetProperty(prop))
    {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    int parsed_major;
    int parsed_minor;
    int parsed_patch;
    switch(sscanf(version, "%d.%d.%d",
                  &parsed_major, &parsed_minor, &parsed_patch))
      {
      case 3: patch = parsed_patch; // no break!
      case 2: minor = parsed_minor; // no break!
      case 1: major = parsed_major; // no break!
      default: break;
      }
    }
}